

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O3

void __thiscall
double_conversion::Single::NormalizedBoundaries(Single *this,DiyFp *out_m_minus,DiyFp *out_m_plus)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  int32_t exponent;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar1 = this->d32_;
  uVar8 = uVar1 & 0x7fffff;
  bVar10 = (uVar1 & 0x7f800000) == 0;
  uVar3 = uVar8 + 0x800000;
  if (bVar10) {
    uVar3 = uVar8;
  }
  iVar4 = -0x95;
  if (!bVar10) {
    iVar4 = (uVar1 >> 0x17 & 0xff) - 0x96;
  }
  uVar5 = (ulong)(uVar3 * 2) + 1;
  iVar7 = iVar4 + -1;
  do {
    uVar6 = uVar5 << 10;
    iVar7 = iVar7 + -10;
    uVar9 = uVar5 >> 0x2c;
    uVar5 = uVar6;
  } while (uVar9 == 0);
  for (; -1 < (long)uVar6; uVar6 = uVar6 * 2) {
    iVar7 = iVar7 + -1;
  }
  iVar2 = iVar4 + -1;
  uVar5 = (ulong)(uVar3 * 2);
  if (uVar8 == 0 && (uVar1 & 0x7f000000) != 0) {
    iVar2 = iVar4 + -2;
    uVar5 = (ulong)(uVar3 * 4);
  }
  out_m_plus->f_ = uVar6;
  out_m_plus->e_ = iVar7;
  out_m_minus->f_ = uVar5 - 1 << ((char)iVar2 - (char)iVar7 & 0x3fU);
  out_m_minus->e_ = iVar7;
  return;
}

Assistant:

uint32_t AsUint32() const {
    return d32_;
  }